

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singular_value_decomposition.cpp
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> *
pseudoInverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          Matrix<double,__1,__1,_0,__1,__1> *a,double epsilon)

{
  double dVar1;
  long lVar2;
  Index IVar3;
  MatrixVType *pMVar4;
  char *__function;
  uint computationOptions;
  long lVar5;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> svd;
  MatrixVType *local_2c0 [4];
  long local_2a0;
  double local_290;
  SingularValuesType *local_288;
  SingularValuesType *local_270;
  long local_260;
  undefined8 local_250;
  MatrixUType *local_248;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_240;
  
  computationOptions = 0x28;
  if ((a->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
      (a->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows) {
    computationOptions = 0x14;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_240,a,computationOptions);
  lVar5 = (a->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar2 = (a->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar5 < lVar2) {
    lVar5 = lVar2;
  }
  if (local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
      m_isInitialized != false) {
    if (local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows < 1) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, 0>::operator()(Index) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, Level = 0]"
                   );
    }
    dVar1 = *local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pMVar4 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
                       (&local_240.
                         super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                       );
    IVar3 = local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
            m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    if (local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_isInitialized != false) {
      if (local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Array<double, -1, 1>]"
                     );
      }
      if ((pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols == local_240.
                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                    m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows) {
        local_248 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::
                    matrixU(&local_240.
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                           );
        local_288 = &local_240.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_singularValues;
        local_290 = ABS(dVar1) * (double)lVar5 * epsilon;
        local_2a0 = IVar3;
        local_260 = IVar3;
        local_250 = 0;
        local_2c0[0] = pMVar4;
        local_270 = local_288;
        if (local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
            m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows ==
            (local_248->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::DiagonalWrapper<Eigen::MatrixWrapper<Eigen::Select<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,double,(Eigen::internal::ComparisonName)1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>>>const>const>,1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
                     (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::DiagonalWrapper<const_Eigen::MatrixWrapper<const_Eigen::Select<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>_>,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
                      *)local_2c0);
          Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_240);
          return __return_storage_ptr__;
        }
        __function = 
        "Eigen::Product<Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::DiagonalWrapper<const Eigen::MatrixWrapper<const Eigen::Select<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double, double, Eigen::internal::cmp_LT>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>>>>, 1>, Eigen::Transpose<const Eigen::Matrix<double, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::DiagonalWrapper<const Eigen::MatrixWrapper<const Eigen::Select<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double, double, Eigen::internal::cmp_LT>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>>>>, 1>, Rhs = Eigen::Transpose<const Eigen::Matrix<double, -1, -1>>, Option = 0]"
        ;
      }
      else {
        __function = 
        "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::DiagonalWrapper<const Eigen::MatrixWrapper<const Eigen::Select<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double, double, Eigen::internal::cmp_LT>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>>>>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::DiagonalWrapper<const Eigen::MatrixWrapper<const Eigen::Select<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double, double, Eigen::internal::cmp_LT>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, 1>>>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>>>>, Option = 1]"
        ;
      }
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
    }
  }
  __assert_fail("m_isInitialized && \"SVD is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/SVD/SVDBase.h",0x102,
                "void Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double, -1, -1>>>::_check_compute_assertions() const [Derived = Eigen::JacobiSVD<Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

T pseudoInverse(const T &a, double epsilon = std::numeric_limits<double>::epsilon())
{
    //Eigen::DecompositionOptions flags;
    int flags;
    // For a non-square matrix
    if(a.cols()!=a.rows())
    {
        flags=Eigen::ComputeThinU | Eigen::ComputeThinV;
    }
    else
    {
        flags=Eigen::ComputeFullU | Eigen::ComputeFullV;
    }
    Eigen::JacobiSVD< T > svd(a ,flags);

    double tolerance = epsilon * std::max(a.cols(), a.rows()) *svd.singularValues().array().abs()(0);
    return svd.matrixV() *  (svd.singularValues().array().abs() > tolerance).select(svd.singularValues().array().inverse(), 0).matrix().asDiagonal() * svd.matrixU().adjoint();
}